

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O2

int duckdb_shell_sqlite3_exec
              (sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char **__ptr;
  char **__ptr_00;
  uchar *puVar5;
  pointer pcVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  sqlite3_stmt *pStmt;
  uint local_54;
  char **local_50;
  sqlite3_callback local_48;
  char *zLeftover;
  void *local_38;
  
  pStmt = (sqlite3_stmt *)0x0;
  if (zSql == (char *)0x0) {
    zSql = anon_var_dwarf_4b71df5 + 9;
  }
  iVar2 = 0;
  local_48 = xCallback;
  local_38 = pArg;
  do {
    __ptr = (char **)0x0;
    if (iVar2 != 0) {
      __ptr_00 = (char **)0x0;
      __ptr = (char **)0x0;
LAB_001f51bd:
      if (pStmt != (sqlite3_stmt *)0x0) {
        duckdb_shell_sqlite3_finalize(pStmt);
      }
      free(__ptr);
      free(__ptr_00);
      if (((pzErrMsg != (char **)0x0) && (iVar2 != 0)) && (*pzErrMsg == (char *)0x0)) {
        pcVar4 = sqlite3_strdup("Unknown error in DuckDB!");
        *pzErrMsg = pcVar4;
      }
      return iVar2;
    }
    if (*zSql == '\0') {
      __ptr_00 = (char **)0x0;
LAB_001f51bb:
      iVar2 = 0;
      goto LAB_001f51bd;
    }
    pStmt = (sqlite3_stmt *)0x0;
    iVar2 = duckdb_shell_sqlite3_prepare_v2(db,zSql,-1,&pStmt,&zLeftover);
    if (iVar2 == 0) {
      if (pStmt == (sqlite3_stmt *)0x0) {
        iVar2 = 0;
        zSql = zLeftover;
      }
      else {
        local_54 = duckdb_shell_sqlite3_column_count(pStmt);
        lVar8 = (long)(int)local_54;
        __ptr = (char **)malloc(lVar8 << 3);
        __ptr_00 = (char **)malloc(lVar8 << 3);
        if ((__ptr == (char **)0x0) || (__ptr_00 == (char **)0x0)) goto LAB_001f51bb;
        uVar1 = local_54;
        if ((int)local_54 < 1) {
          uVar1 = 0;
        }
        local_50 = pzErrMsg;
        for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
          pcVar4 = duckdb_shell_sqlite3_column_name(pStmt,(int)uVar7);
          __ptr[uVar7] = pcVar4;
        }
        do {
          bVar9 = local_48 != (sqlite3_callback)0x0;
          iVar2 = duckdb_shell_sqlite3_step(pStmt);
          if (iVar2 == 100 && bVar9) {
            for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
              puVar5 = duckdb_shell_sqlite3_column_text(pStmt,(int)uVar7);
              __ptr_00[uVar7] = (char *)puVar5;
              if ((puVar5 == (uchar *)0x0) &&
                 (iVar3 = duckdb_shell_sqlite3_column_type(pStmt,(int)uVar7), iVar3 != 5)) {
                fwrite("sqlite3_exec: out of memory.\n",0x1d,1,_stderr);
                iVar2 = 100;
                pzErrMsg = local_50;
                goto LAB_001f51bd;
              }
            }
            iVar3 = (*local_48)(local_38,local_54,__ptr_00,__ptr);
            if (iVar3 != 0) {
              duckdb_shell_sqlite3_finalize(pStmt);
              pStmt = (sqlite3_stmt *)0x0;
              fwrite("sqlite3_exec: callback returned non-zero. Aborting.\n",0x34,1,_stderr);
              iVar2 = 4;
              pzErrMsg = local_50;
              goto LAB_001f51bd;
            }
          }
          pzErrMsg = local_50;
        } while (iVar2 == 100);
        if (iVar2 != 0x65) {
          if (local_50 != (char **)0x0) {
            if (db == (sqlite3 *)0x0) {
              pcVar6 = anon_var_dwarf_4b71df5 + 9;
LAB_001f5258:
              pcVar4 = sqlite3_strdup(pcVar6);
            }
            else {
              pcVar6 = (db->last_error).final_message._M_dataplus._M_p;
              if (pcVar6 != (pointer)0x0) goto LAB_001f5258;
              pcVar4 = (char *)0x0;
            }
            *pzErrMsg = pcVar4;
          }
          goto LAB_001f51bd;
        }
        iVar2 = duckdb_shell_sqlite3_finalize(pStmt);
        pzErrMsg = local_50;
        pStmt = (sqlite3_stmt *)0x0;
        zSql = zLeftover + -1;
        do {
          pcVar4 = zSql + 1;
          zSql = zSql + 1;
          iVar3 = isspace((int)*pcVar4);
        } while (iVar3 != 0);
        free(__ptr);
        free(__ptr_00);
      }
    }
    else if (pzErrMsg != (char **)0x0) {
      pcVar6 = anon_var_dwarf_4b71df5 + 9;
      if ((db == (sqlite3 *)0x0) ||
         (pcVar6 = (db->last_error).final_message._M_dataplus._M_p, pcVar6 != (pointer)0x0)) {
        pcVar4 = sqlite3_strdup(pcVar6);
      }
      else {
        pcVar4 = (char *)0x0;
      }
      *pzErrMsg = pcVar4;
    }
  } while( true );
}

Assistant:

int sqlite3_exec(sqlite3 *db,                /* The database on which the SQL executes */
                 const char *zSql,           /* The SQL to be executed */
                 sqlite3_callback xCallback, /* Invoke this callback routine */
                 void *pArg,                 /* First argument to xCallback() */
                 char **pzErrMsg             /* Write error messages here */
) {
	int rc = SQLITE_OK;            /* Return code */
	const char *zLeftover;         /* Tail of unprocessed SQL */
	sqlite3_stmt *pStmt = nullptr; /* The current SQL statement */
	char **azCols = nullptr;       /* Names of result columns */
	char **azVals = nullptr;       /* Result values */

	if (zSql == nullptr) {
		zSql = "";
	}

	while (rc == SQLITE_OK && zSql[0]) {
		int nCol;

		pStmt = nullptr;
		rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
		if (rc != SQLITE_OK) {
			if (pzErrMsg) {
				auto errmsg = sqlite3_errmsg(db);
				*pzErrMsg = errmsg ? sqlite3_strdup(errmsg) : nullptr;
			}
			continue;
		}
		if (!pStmt) {
			/* this happens for a comment or white-space */
			zSql = zLeftover;
			continue;
		}

		nCol = sqlite3_column_count(pStmt);
		azCols = (char **)malloc(nCol * sizeof(const char *));
		azVals = (char **)malloc(nCol * sizeof(const char *));
		if (!azCols || !azVals) {
			goto exec_out;
		}
		for (int i = 0; i < nCol; i++) {
			azCols[i] = (char *)sqlite3_column_name(pStmt, i);
		}

		while (true) {
			rc = sqlite3_step(pStmt);

			/* Invoke the callback function if required */
			if (xCallback && rc == SQLITE_ROW) {
				for (int i = 0; i < nCol; i++) {
					azVals[i] = (char *)sqlite3_column_text(pStmt, i);
					if (!azVals[i] && sqlite3_column_type(pStmt, i) != SQLITE_NULL) {
						fprintf(stderr, "sqlite3_exec: out of memory.\n");
						goto exec_out;
					}
				}
				if (xCallback(pArg, nCol, azVals, azCols)) {
					/* EVIDENCE-OF: R-38229-40159 If the callback function to
					** sqlite3_exec() returns non-zero, then sqlite3_exec() will
					** return SQLITE_ABORT. */
					rc = SQLITE_ABORT;
					sqlite3_finalize(pStmt);
					pStmt = 0;
					fprintf(stderr, "sqlite3_exec: callback returned non-zero. "
					                "Aborting.\n");
					goto exec_out;
				}
			}
			if (rc == SQLITE_DONE) {
				rc = sqlite3_finalize(pStmt);
				pStmt = nullptr;
				zSql = zLeftover;
				while (isspace(zSql[0]))
					zSql++;
				break;
			} else if (rc != SQLITE_ROW) {
				// error
				if (pzErrMsg) {
					auto errmsg = sqlite3_errmsg(db);
					*pzErrMsg = errmsg ? sqlite3_strdup(errmsg) : nullptr;
				}
				goto exec_out;
			}
		}

		sqlite3_free(azCols);
		sqlite3_free(azVals);
		azCols = nullptr;
		azVals = nullptr;
	}

exec_out:
	if (pStmt) {
		sqlite3_finalize(pStmt);
	}
	sqlite3_free(azCols);
	sqlite3_free(azVals);
	if (rc != SQLITE_OK && pzErrMsg && !*pzErrMsg) {
		// error but no error message set
		*pzErrMsg = sqlite3_strdup("Unknown error in DuckDB!");
	}
	return rc;
}